

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

If_DsdMan_t * If_DsdManFilter(If_DsdMan_t *p,int Limit)

{
  int iVar1;
  If_DsdMan_t *pNew;
  Vec_Int_t *vMap;
  int *__s;
  int iVar2;
  long lVar3;
  
  pNew = If_DsdManAlloc(p->nVars,p->LutSize);
  iVar1 = (p->vObjs).nSize;
  vMap = (Vec_Int_t *)malloc(0x10);
  iVar2 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar2 = iVar1;
  }
  vMap->nSize = 0;
  vMap->nCap = iVar2;
  if (iVar2 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar2 << 2);
  }
  vMap->pArray = __s;
  vMap->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0xff,(long)iVar1 << 2);
  }
  if ((0 < iVar1) && (*__s = 0, iVar1 != 1)) {
    __s[1] = 1;
    if (2 < (p->vObjs).nSize) {
      lVar3 = 2;
      do {
        if (Limit <= (int)(*(uint *)((long)(p->vObjs).pArray[lVar3] + 4) >> 9 & 0x3ffff)) {
          If_DsdManFilter_rec(pNew,p,(int)lVar3,vMap);
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < (p->vObjs).nSize);
    }
    free(__s);
    vMap->pArray = (int *)0x0;
    free(vMap);
    return pNew;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

If_DsdMan_t * If_DsdManFilter( If_DsdMan_t * p, int Limit )
{
    If_DsdMan_t * pNew = If_DsdManAlloc( p->nVars, p->LutSize );
    If_DsdObj_t * pObj; 
    Vec_Int_t * vMap;
    int i;
    vMap = Vec_IntStartFull( Vec_PtrSize(&p->vObjs) );
    Vec_IntWriteEntry( vMap, 0, 0 );
    Vec_IntWriteEntry( vMap, 1, 1 );
    If_DsdVecForEachNode( &p->vObjs, pObj, i )
        if ( (int)pObj->Count >= Limit )
            If_DsdManFilter_rec( pNew, p, i, vMap );
    Vec_IntFree( vMap );
    return pNew;
}